

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall ExampleAppLog::ExampleAppLog(ExampleAppLog *this)

{
  ExampleAppLog *this_local;
  
  ImGuiTextBuffer::ImGuiTextBuffer(&this->Buf);
  ImGuiTextFilter::ImGuiTextFilter(&this->Filter,"");
  ImVector<int>::ImVector(&this->LineOffsets);
  this->AutoScroll = true;
  Clear(this);
  return;
}

Assistant:

ExampleAppLog()
    {
        AutoScroll = true;
        Clear();
    }